

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O2

void __thiscall
CompressedArray::const_iterator::switch_to_record(const_iterator *this,uint32_t record_index)

{
  CompressedArray *pCVar1;
  pointer pBVar2;
  ulong uVar3;
  difference_type __d;
  ulong uVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  uint32_t block_index;
  pointer pBVar6;
  const_iterator local_50;
  
  pCVar1 = this->array;
  if (pCVar1->record_count < record_index) {
    record_index = pCVar1->record_count;
  }
  pBVar2 = (pCVar1->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(pCVar1->headers).
                super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2 >> 4;
  pBVar6 = pBVar2;
  while (uVar3 = uVar4, 0 < (long)uVar3) {
    uVar4 = uVar3 >> 1;
    if (pBVar6[uVar4].record_index <= record_index) {
      pBVar6 = pBVar6 + uVar4 + 1;
      uVar4 = ~uVar4 + uVar3;
    }
  }
  block_index = (uint32_t)((ulong)((long)pBVar6 + (-0x10 - (long)pBVar2)) >> 4);
  switch_to_block(this,block_index);
  uVar5 = extraout_RDX;
  while ((this->block_index == block_index && (this->record_index < record_index))) {
    operator++(&local_50,this,(int)uVar5);
    uVar5 = extraout_RDX_00;
  }
  return;
}

Assistant:

void CompressedArray::const_iterator::switch_to_record(uint32_t record_index) {
    if (record_index > array->record_count)
        record_index = array->record_count;

    BlockHeader header;
    header.record_index = record_index;
    auto it = upper_bound(array->headers.begin(), array->headers.end(), header,
                          [](const BlockHeader& first, const BlockHeader& second) {
                              return first.record_index < second.record_index;
                          });
    --it;

    uint32_t block_index = uint32_t(it - array->headers.begin());
    switch_to_block(block_index);
    while (this->block_index == block_index && this->record_index < record_index)
        (*this)++;
}